

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int read_private_key_from_memory
              (void **key_ctx,pem_read_bio_func read_private_key,char *filedata,size_t filedata_len,
              uchar *passphrase)

{
  BIO *a;
  void *pvVar1;
  BIO *bp;
  uchar *passphrase_local;
  size_t filedata_len_local;
  char *filedata_local;
  pem_read_bio_func read_private_key_local;
  void **key_ctx_local;
  
  *key_ctx = (void *)0x0;
  a = BIO_new_mem_buf(filedata,(int)filedata_len);
  if (a == (BIO *)0x0) {
    key_ctx_local._4_4_ = -1;
  }
  else {
    pvVar1 = (*read_private_key)((BIO *)a,(void **)0x0,passphrase_cb,passphrase);
    *key_ctx = pvVar1;
    BIO_free(a);
    key_ctx_local._4_4_ = -1;
    if (*key_ctx != (void *)0x0) {
      key_ctx_local._4_4_ = 0;
    }
  }
  return key_ctx_local._4_4_;
}

Assistant:

static int
read_private_key_from_memory(void **key_ctx,
                             pem_read_bio_func read_private_key,
                             const char *filedata,
                             size_t filedata_len,
                             unsigned const char *passphrase)
{
    BIO * bp;

    *key_ctx = NULL;

#if OPENSSL_VERSION_NUMBER >= 0x1000200fL
    bp = BIO_new_mem_buf(filedata, (int)filedata_len);
#else
    bp = BIO_new_mem_buf((char *)filedata, (int)filedata_len);
#endif
    if(!bp) {
        return -1;
    }

    *key_ctx = read_private_key(bp, NULL, (pem_password_cb *) passphrase_cb,
                                (void *) passphrase);

    BIO_free(bp);
    return (*key_ctx) ? 0 : -1;
}